

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCuts.c
# Opt level: O2

int Aig_CutFilter(Aig_ManCut_t *p,Aig_Obj_t *pObj,Aig_Cut_t *pCut)

{
  int iVar1;
  uint uVar2;
  Aig_Cut_t *pDom;
  int iVar3;
  bool bVar4;
  
  pDom = p->pCuts[pObj->Id];
  iVar3 = p->nCutsMax;
  if (p->nCutsMax < 1) {
    iVar3 = 0;
  }
  do {
    bVar4 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar4) {
      return 0;
    }
    if (pDom != pCut && '\x01' < pDom->nFanins) {
      uVar2 = pCut->uSign & pDom->uSign;
      if (pCut->nFanins < pDom->nFanins) {
        if ((uVar2 == pCut->uSign) && (iVar1 = Aig_CutCheckDominance(pCut,pDom), iVar1 != 0)) {
          pDom->nFanins = '\0';
        }
      }
      else if ((uVar2 == pDom->uSign) && (iVar1 = Aig_CutCheckDominance(pDom,pCut), iVar1 != 0)) {
        pCut->nFanins = '\0';
        return 1;
      }
    }
    pDom = (Aig_Cut_t *)((long)&pDom->pNext + (long)pDom->nCutSize);
  } while( true );
}

Assistant:

int Aig_CutFilter( Aig_ManCut_t * p, Aig_Obj_t * pObj, Aig_Cut_t * pCut )
{ 
    Aig_Cut_t * pTemp;
    int i;
    // go through the cuts of the node
    Aig_ObjForEachCut( p, pObj, pTemp, i )
    {
        if ( pTemp->nFanins < 2 )
            continue;
        if ( pTemp == pCut )
            continue;
        if ( pTemp->nFanins > pCut->nFanins )
        {
            // skip the non-contained cuts
            if ( (pTemp->uSign & pCut->uSign) != pCut->uSign )
                continue;
            // check containment seriously
            if ( Aig_CutCheckDominance( pCut, pTemp ) )
            {
                // remove contained cut
                pTemp->nFanins = 0;
            }
         }
        else
        {
            // skip the non-contained cuts
            if ( (pTemp->uSign & pCut->uSign) != pTemp->uSign )
                continue;
            // check containment seriously
            if ( Aig_CutCheckDominance( pTemp, pCut ) )
            {
                // remove the given
                pCut->nFanins = 0;
                return 1;
            }
        }
    }
    return 0;
}